

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EdgeTopology.hpp
# Opt level: O0

EdgeTopology *
eos::morphablemodel::load_edge_topology(EdgeTopology *__return_storage_ptr__,string *filename)

{
  byte bVar1;
  runtime_error *this;
  NameValuePair<eos::morphablemodel::EdgeTopology_&> local_440;
  undefined1 local_430 [8];
  JSONInputArchive output_archive;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_228;
  ifstream file;
  string *filename_local;
  EdgeTopology *edge_topology;
  
  EdgeTopology::EdgeTopology(__return_storage_ptr__);
  std::ifstream::ifstream(&local_228,(string *)filename,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) != 0) {
    output_archive.itsDocument.parseResult_.offset_._7_1_ = 1;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_258,"Error opening file for reading: ",filename);
    std::runtime_error::runtime_error(this,(string *)&local_258);
    output_archive.itsDocument.parseResult_.offset_._7_1_ = 0;
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cereal::JSONInputArchive::JSONInputArchive((JSONInputArchive *)local_430,(istream *)&local_228);
  local_440 = cereal::make_nvp<eos::morphablemodel::EdgeTopology&>
                        ("edge_topology",__return_storage_ptr__);
  cereal::InputArchive<cereal::JSONInputArchive,0u>::operator()
            ((InputArchive<cereal::JSONInputArchive,0u> *)local_430,&local_440);
  cereal::JSONInputArchive::~JSONInputArchive((JSONInputArchive *)local_430);
  std::ifstream::~ifstream(&local_228);
  return __return_storage_ptr__;
}

Assistant:

inline EdgeTopology load_edge_topology(std::string filename)
{
    EdgeTopology edge_topology;
    std::ifstream file(filename);
    if (!file)
    {
        throw std::runtime_error("Error opening file for reading: " + filename);
    }
    cereal::JSONInputArchive output_archive(file);
    output_archive(cereal::make_nvp("edge_topology", edge_topology));

    return edge_topology;
}